

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcProjectionCurve::~IfcProjectionCurve
          (IfcProjectionCurve *this,void **vtt)

{
  void **vtt_local;
  IfcProjectionCurve *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectionCurve,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectionCurve,_0UL> *)
             &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.field_0x90,
             vtt + 0x17);
  IfcAnnotationCurveOccurrence::~IfcAnnotationCurveOccurrence
            (&this->super_IfcAnnotationCurveOccurrence,vtt + 1);
  return;
}

Assistant:

IfcProjectionCurve() : Object("IfcProjectionCurve") {}